

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_afalg.c
# Opt level: O0

int afalg_ciphers(ENGINE *e,EVP_CIPHER **cipher,int **nids,int nid)

{
  EVP_CIPHER *pEVar1;
  int in_ECX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  int r;
  int in_stack_ffffffffffffffcc;
  int local_28;
  int local_4;
  
  local_28 = 1;
  if (in_RSI == (undefined8 *)0x0) {
    *in_RDX = afalg_cipher_nids;
    local_4 = 3;
  }
  else {
    if (((in_ECX == 0x1a3) || (in_ECX == 0x1a7)) || (in_ECX == 0x1ab)) {
      pEVar1 = afalg_aes_cbc(in_stack_ffffffffffffffcc);
      *in_RSI = pEVar1;
    }
    else {
      *in_RSI = 0;
      local_28 = 0;
    }
    local_4 = local_28;
  }
  return local_4;
}

Assistant:

static int afalg_ciphers(ENGINE *e, const EVP_CIPHER **cipher,
                         const int **nids, int nid)
{
    int r = 1;

    if (cipher == NULL) {
        *nids = afalg_cipher_nids;
        return (sizeof(afalg_cipher_nids) / sizeof(afalg_cipher_nids[0]));
    }

    switch (nid) {
    case NID_aes_128_cbc:
    case NID_aes_192_cbc:
    case NID_aes_256_cbc:
        *cipher = afalg_aes_cbc(nid);
        break;
    default:
        *cipher = NULL;
        r = 0;
    }
    return r;
}